

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void map_end(EditLine *el)

{
  free((el->el_map).alt);
  (el->el_map).alt = (el_action_t *)0x0;
  free((el->el_map).key);
  (el->el_map).key = (el_action_t *)0x0;
  (el->el_map).emacs = (el_action_t *)0x0;
  (el->el_map).vic = (el_action_t *)0x0;
  (el->el_map).vii = (el_action_t *)0x0;
  free((el->el_map).help);
  (el->el_map).help = (el_bindings_t *)0x0;
  free((el->el_map).func);
  (el->el_map).func = (el_func_t *)0x0;
  return;
}

Assistant:

libedit_private void
map_end(EditLine *el)
{

	el_free(el->el_map.alt);
	el->el_map.alt = NULL;
	el_free(el->el_map.key);
	el->el_map.key = NULL;
	el->el_map.emacs = NULL;
	el->el_map.vic = NULL;
	el->el_map.vii = NULL;
	el_free(el->el_map.help);
	el->el_map.help = NULL;
	el_free(el->el_map.func);
	el->el_map.func = NULL;
}